

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O0

void qemu_cmdline(char *name,char *value)

{
  int iVar1;
  undefined8 in_RSI;
  char *in_RDI;
  char *buf;
  char *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  iVar1 = strcmp(in_RDI,"android.ril");
  if ((iVar1 == 0) && (iVar1 = asprintf(&local_18,"/dev/%s",local_10), iVar1 != -1)) {
    log_write(6,"<6>init: nani- buf:: %s\n",local_18);
  }
  return;
}

Assistant:

void qemu_cmdline(const char* name, const char *value)
{
    char *buf;
    if (!strcmp(name, "android.ril")) {
        /* cmd line params currently assume /dev/ prefix */
        if (asprintf(&buf, CMDLINE_PREFIX"/%s", value) == -1) {
            return;
        }
        INFO("nani- buf:: %s\n", buf);
    }
}